

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int eval_relational_expr
              (lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,lyxp_set *set
              ,int options)

{
  ushort uVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint16_t uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  lyxp_set *trg;
  undefined1 auStack_c8 [8];
  lyxp_set set2;
  lyxp_set orig_set;
  
  set2.ctx_pos = 0;
  set2.ctx_size = 0;
  auStack_c8 = (undefined1  [8])0x0;
  set2.type = LYXP_SET_EMPTY;
  set2._4_4_ = 0;
  set2._8_8_ = 0;
  set2.val.nodes = (lyxp_set_nodes *)0x0;
  set2.val._8_8_ = 0;
  set2.used = 0;
  set2.size = 0;
  uVar4 = *exp_idx;
  uVar2 = exp_repeat_peek(exp,uVar4);
  if (((uVar2 == 0) || (exp->tokens[uVar2] != LYXP_TOKEN_OPERATOR_COMP)) ||
     ((byte)(exp->expr[exp->expr_pos[uVar2]] | 2U) != 0x3e)) {
    uVar2 = 0;
  }
  else {
    exp_repeat_pop(exp,uVar4);
    set_fill_set((lyxp_set *)&set2.ctx_pos,set);
  }
  iVar5 = eval_additive_expr(exp,exp_idx,cur_node,param_4,set,options);
  if (iVar5 == 0) {
    pcVar8 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar8 = "skipped";
    }
    iVar5 = 0;
    do {
      while( true ) {
        while( true ) {
          if (uVar2 == 0) goto LAB_00162f85;
          uVar1 = *exp_idx;
          uVar3 = uVar1;
          if ('\x02' < ly_log_level) {
            pcVar7 = print_token(exp->tokens[uVar1]);
            ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relational_expr",pcVar8,pcVar7,
                       (ulong)exp->expr_pos[*exp_idx]);
            uVar3 = *exp_idx;
          }
          uVar4 = uVar3 + 1;
          *exp_idx = uVar4;
          uVar2 = exp_repeat_peek(exp,uVar4);
          if (((uVar2 == 0) || (exp->tokens[uVar2] != LYXP_TOKEN_OPERATOR_COMP)) ||
             ((byte)(exp->expr[exp->expr_pos[uVar2]] | 2U) != 0x3e)) {
            uVar2 = 0;
          }
          else {
            exp_repeat_pop(exp,uVar4);
          }
          if (set != (lyxp_set *)0x0) break;
          iVar6 = eval_additive_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
          if (iVar6 != 0) {
            return iVar6;
          }
        }
        trg = (lyxp_set *)auStack_c8;
        set_fill_set(trg,(lyxp_set *)&set2.ctx_pos);
        iVar6 = eval_additive_expr(exp,exp_idx,cur_node,param_4,trg,options);
        if (iVar6 != 0) goto LAB_0016313f;
        if ((options & 0x1cU) == 0) break;
        set_snode_merge(set,trg);
        set_snode_clear_ctx(set);
      }
      iVar6 = moveto_op_comp(set,trg,exp->expr + exp->expr_pos[uVar1],cur_node,param_4,options);
    } while (iVar6 == 0);
    iVar6 = -1;
LAB_0016313f:
    iVar5 = iVar6;
    lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
  }
  else {
LAB_00162f85:
    trg = (lyxp_set *)&set2.ctx_pos;
  }
  lyxp_set_cast(trg,LYXP_SET_EMPTY,cur_node,param_4,options);
  return iVar5;
}

Assistant:

static int
eval_relational_expr(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                     struct lyxp_set *set, int options)
{
    int ret;
    uint16_t this_op, op_exp;
    struct lyxp_set orig_set, set2;

    memset(&orig_set, 0, sizeof orig_set);
    memset(&set2, 0, sizeof set2);

    op_exp = exp_repeat_peek(exp, *exp_idx);
    if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_COMP)
            && ((exp->expr[exp->expr_pos[op_exp]] == '<') || (exp->expr[exp->expr_pos[op_exp]] == '>'))) {
        /* there is an operator */
        exp_repeat_pop(exp, *exp_idx);
        set_fill_set(&orig_set, set);
    } else {
        op_exp = 0;
    }

    /* AdditiveExpr */
    ret = eval_additive_expr(exp, exp_idx, cur_node, local_mod, set, options);
    if (ret) {
        lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        return ret;
    }

    /* ('<' / '>' / '<=' / '>=' AdditiveExpr)* */
    while (op_exp) {
        this_op = *exp_idx;

        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        op_exp = exp_repeat_peek(exp, *exp_idx);
        if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_COMP)
                && ((exp->expr[exp->expr_pos[op_exp]] == '<') || (exp->expr[exp->expr_pos[op_exp]] == '>'))) {
            /* there is another operator */
            exp_repeat_pop(exp, *exp_idx);
        } else {
            op_exp = 0;
        }

        if (!set) {
            ret = eval_additive_expr(exp, exp_idx, cur_node, local_mod, NULL, options);
            if (ret) {
                return ret;
            }
            continue;
        }

        set_fill_set(&set2, &orig_set);
        ret = eval_additive_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
        if (ret) {
            lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return ret;
        }

        /* eval */
        if (options & LYXP_SNODE_ALL) {
            set_snode_merge(set, &set2);
            set_snode_clear_ctx(set);
        } else {
            if (moveto_op_comp(set, &set2, &exp->expr[exp->expr_pos[this_op]], cur_node, local_mod, options)) {
                lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
                lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
                return -1;
            }
        }
    }

    lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
    return EXIT_SUCCESS;
}